

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O1

CTPNCodeBody * __thiscall
CTcParser::parse_nested_code_body
          (CTcParser *this,int eq_before_brace,int self_valid,int *p_argc,int *p_opt_argc,
          int *p_varargs,int *p_varargs_list,CTcSymLocal **p_varargs_list_local,int *p_has_retval,
          int *err,CTcPrsSymtab *param_10,tcprs_codebodytype cb_type)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  CTcPrsSymtab *pCVar5;
  CTcCodeBodyRef *enclosing_code_body;
  CTPNStmEnclosing *pCVar6;
  CTcPrsSymtab *pCVar7;
  CTcPrsSymtab *pCVar8;
  size_t sVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  CTPNCodeBody *pCVar16;
  
  pCVar5 = this->enclosing_local_symtab_;
  bVar1 = this->field_0x1e8;
  iVar2 = this->local_ctx_var_num_;
  sVar9 = this->ctx_var_props_used_;
  iVar3 = this->next_ctx_arr_idx_;
  iVar4 = this->local_ctx_needs_full_method_ctx_;
  enclosing_code_body = this->cur_code_body_;
  iVar10 = this->local_cnt_;
  iVar11 = this->max_local_cnt_;
  pCVar6 = this->enclosing_stm_;
  iVar12 = this->self_valid_;
  iVar13 = this->self_referenced_;
  iVar14 = this->full_method_ctx_referenced_;
  iVar15 = this->local_ctx_needs_self_;
  pCVar7 = this->goto_symtab_;
  pCVar8 = this->local_symtab_;
  pCVar16 = parse_code_body(this,eq_before_brace,0,self_valid,p_argc,p_opt_argc,p_varargs,
                            p_varargs_list,p_varargs_list_local,p_has_retval,err,param_10,cb_type,
                            (propset_def *)0x0,0,enclosing_code_body,(CTcFormalTypeList **)0x0);
  this->cur_code_body_ = enclosing_code_body;
  this->enclosing_local_symtab_ = pCVar5;
  this->goto_symtab_ = pCVar7;
  this->local_symtab_ = pCVar8;
  this->local_cnt_ = iVar10;
  this->max_local_cnt_ = iVar11;
  this->enclosing_stm_ = pCVar6;
  this->field_0x1e8 = this->field_0x1e8 & 0xfe | bVar1 & 1;
  this->local_ctx_var_num_ = iVar2;
  this->ctx_var_props_used_ = (long)(int)sVar9;
  this->next_ctx_arr_idx_ = iVar3;
  this->self_valid_ = iVar12;
  this->self_referenced_ = iVar13;
  this->full_method_ctx_referenced_ = iVar14;
  this->local_ctx_needs_self_ = iVar15;
  this->local_ctx_needs_full_method_ctx_ = iVar4;
  return pCVar16;
}

Assistant:

CTPNCodeBody *CTcParser::parse_nested_code_body(
    int eq_before_brace, int self_valid,
    int *p_argc, int *p_opt_argc, int *p_varargs,
    int *p_varargs_list, CTcSymLocal **p_varargs_list_local,
    int *p_has_retval, int *err, CTcPrsSymtab *local_symtab,
    tcprs_codebodytype cb_type)
{
    /* remember the original parser state */
    CTcPrsSymtab *old_local_symtab = local_symtab_;
    CTcPrsSymtab *old_enclosing_local_symtab = enclosing_local_symtab_;
    CTPNStmEnclosing *old_enclosing_stm = enclosing_stm_;
    CTcPrsSymtab *old_goto_symtab = goto_symtab_;
    int old_local_cnt = local_cnt_;
    int old_max_local_cnt = max_local_cnt_;
    int old_has_local_ctx = has_local_ctx_;
    int old_local_ctx_var_num = local_ctx_var_num_;
    int old_ctx_var_props_used = ctx_var_props_used_;
    int old_next_ctx_arr_idx = next_ctx_arr_idx_;
    int old_self_valid = self_valid_;
    int old_self_referenced = self_referenced_;
    int old_full_method_ctx_referenced = full_method_ctx_referenced_;
    int old_local_ctx_needs_self = local_ctx_needs_self_;
    int old_local_ctx_needs_full_method_ctx = local_ctx_needs_full_method_ctx_;
    CTcCodeBodyRef *old_cur_code_body = cur_code_body_;

    /* parse the code body */
    CTPNCodeBody *code_body = parse_code_body(
        eq_before_brace, FALSE, self_valid,
        p_argc, p_opt_argc, p_varargs, p_varargs_list, p_varargs_list_local,
        p_has_retval, err, local_symtab, cb_type, 0, 0, cur_code_body_, 0);

    /* restore the parser state */
    cur_code_body_ = old_cur_code_body;
    local_symtab_ = old_local_symtab;
    enclosing_local_symtab_ = old_enclosing_local_symtab;
    enclosing_stm_ = old_enclosing_stm;
    goto_symtab_ = old_goto_symtab;
    local_cnt_ = old_local_cnt;
    max_local_cnt_ = old_max_local_cnt;
    has_local_ctx_ = old_has_local_ctx;
    local_ctx_var_num_ = old_local_ctx_var_num;
    ctx_var_props_used_ = old_ctx_var_props_used;
    next_ctx_arr_idx_ = old_next_ctx_arr_idx;
    self_valid_ = old_self_valid;
    self_referenced_ = old_self_referenced;
    full_method_ctx_referenced_= old_full_method_ctx_referenced;
    local_ctx_needs_self_ = old_local_ctx_needs_self;
    local_ctx_needs_full_method_ctx_ = old_local_ctx_needs_full_method_ctx;

    /* return the code body we parsed */
    return code_body;
}